

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_int64 fts3DocidRange(sqlite3_value *pVal,i64 iDefault)

{
  ushort uVar1;
  ulong uVar2;
  Mem *pMem;
  
  if (pVal != (sqlite3_value *)0x0) {
    uVar1 = pVal->flags;
    if ((uVar1 & 0xf) == 2) {
      applyNumericAffinity(pVal,0);
      uVar1 = pVal->flags;
    }
    uVar2 = (ulong)uVar1;
    if ((0x50505050U >> (uVar1 & 0x1f) & 1) != 0) {
      uVar2 = sqlite3VdbeIntValue(pVal);
    }
    if ((0x50505050UL >> ((byte)uVar1 & 0x1f) & 1) != 0) {
      return uVar2;
    }
  }
  return iDefault;
}

Assistant:

static sqlite3_int64 fts3DocidRange(sqlite3_value *pVal, i64 iDefault){
  if( pVal ){
    int eType = sqlite3_value_numeric_type(pVal);
    if( eType==SQLITE_INTEGER ){
      return sqlite3_value_int64(pVal);
    }
  }
  return iDefault;
}